

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void add_entities(ecs_world_t *world,ecs_entity_t entity,ecs_entities_t *components)

{
  _Bool _Var1;
  ecs_stage_t *stage_00;
  ecs_table_t *dst_table_00;
  ecs_table_t *dst_table;
  ecs_table_t *src_table;
  ecs_entities_t added;
  ecs_entity_t buffer [32];
  ecs_entity_info_t info;
  ecs_stage_t *stage;
  ecs_entities_t *components_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  entity_local = (ecs_entity_t)world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x5a7);
  if (entity_local == 0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x5a7,"void add_entities(ecs_world_t *, ecs_entity_t, ecs_entities_t *)");
  }
  _ecs_assert(components->count < 0x20,2,(char *)0x0,"components->count < ECS_MAX_ADD_REMOVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x5a8);
  if (0x1f < components->count) {
    __assert_fail("components->count < (32)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x5a8,"void add_entities(ecs_world_t *, ecs_entity_t, ecs_entities_t *)");
  }
  stage_00 = ecs_get_stage((ecs_world_t **)&entity_local);
  _Var1 = ecs_defer_add((ecs_world_t *)entity_local,stage_00,entity,components);
  if (!_Var1) {
    ecs_get_info((ecs_world_t *)entity_local,entity,(ecs_entity_info_t *)(buffer + 0x1f));
    src_table = (ecs_table_t *)&added.count;
    added.array._0_4_ = 0;
    dst_table_00 = ecs_table_traverse_add
                             ((ecs_world_t *)entity_local,(ecs_table_t *)info.record,components,
                              (ecs_entities_t *)&src_table);
    commit((ecs_world_t *)entity_local,entity,(ecs_entity_info_t *)(buffer + 0x1f),dst_table_00,
           (ecs_entities_t *)&src_table,(ecs_entities_t *)0x0);
    ecs_defer_flush((ecs_world_t *)entity_local,stage_00);
  }
  return;
}

Assistant:

static
void add_entities(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entities_t * components)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(components->count < ECS_MAX_ADD_REMOVE, ECS_INVALID_PARAMETER, NULL);
    ecs_stage_t *stage = ecs_get_stage(&world);

    if (ecs_defer_add(world, stage, entity, components)) {
        return;
    }

    ecs_entity_info_t info;
    ecs_get_info(world, entity, &info);

    ecs_entity_t buffer[ECS_MAX_ADD_REMOVE];
    ecs_entities_t added = { .array = buffer };

    ecs_table_t *src_table = info.table;
    ecs_table_t *dst_table = ecs_table_traverse_add(
        world, src_table, components, &added);

    commit(world, entity, &info, dst_table, &added, NULL);

    ecs_defer_flush(world, stage);
}